

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::BuiltinSerializer<std::forward_list<int,_std::allocator<int>_>,_void>::
     serialize<OutputStream>(forward_list<int,_std::allocator<int>_> *s,OutputStream *ostream)

{
  _Fwd_list_node_base *p_Var1;
  int iVar2;
  int local_1c;
  
  iVar2 = 0;
  for (p_Var1 = (s->super__Fwd_list_base<int,_std::allocator<int>_>)._M_impl._M_head._M_next;
      p_Var1 != (_Fwd_list_node_base *)0x0; p_Var1 = p_Var1->_M_next) {
    iVar2 = iVar2 + 1;
  }
  local_1c = iVar2;
  std::ostream::write((char *)(ostream->stream + 0x10),(long)&local_1c);
  serialize_elems<OutputStream>(s,iVar2,ostream);
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }